

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O1

int testobjref(global_State *g,GCObject *f,GCObject *t)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  
  bVar1 = t->marked;
  if (((g->currentwhite ^ 0x18) & bVar1) == 0) {
    uVar3 = 1;
    if ((byte)(g->gcstate - 3) < 4) goto LAB_0014b10a;
    bVar2 = f->marked;
    if (g->gckind == '\0') {
      if ((bVar2 & 0x20) != 0) {
        uVar3 = (uint)((bVar1 & 0x18) == 0);
      }
      goto LAB_0014b10a;
    }
    if (((bVar1 & 6) != 0) || ((bVar2 & 0x27) != 0x24)) {
      if ((((bVar2 & 7) == 6) || ((bVar2 & 7) == 3)) && ((bVar1 & 7) == 0)) {
        uVar3 = 0;
        if ((bVar2 & 0x20) != 0) goto LAB_0014b10a;
      }
      uVar3 = 1;
      goto LAB_0014b10a;
    }
  }
  uVar3 = 0;
LAB_0014b10a:
  if (uVar3 == 0) {
    printf("%d(%02X) - ",(ulong)g->gcstate);
    printobj(g,f);
    printf("  ->  ");
    printobj(g,t);
    putchar(10);
  }
  return uVar3;
}

Assistant:

static int testobjref (global_State *g, GCObject *f, GCObject *t) {
  int r1 = testobjref1(g, f, t);
  if (!r1) {
    printf("%d(%02X) - ", g->gcstate, g->currentwhite);
    printobj(g, f);
    printf("  ->  ");
    printobj(g, t);
    printf("\n");
  }
  return r1;
}